

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.hpp
# Opt level: O0

Interval * __thiscall
tcu::Interval::operator&(Interval *__return_storage_ptr__,Interval *this,Interval *other)

{
  double lo_;
  double hi_;
  byte local_19;
  Interval *other_local;
  Interval *this_local;
  
  local_19 = 0;
  if ((this->m_hasNaN & 1U) != 0) {
    local_19 = other->m_hasNaN;
  }
  lo_ = de::max<double>(this->m_lo,other->m_lo);
  hi_ = de::min<double>(this->m_hi,other->m_hi);
  Interval(__return_storage_ptr__,(bool)(local_19 & 1),lo_,hi_);
  return __return_storage_ptr__;
}

Assistant:

Interval	operator&		(const Interval& other) const
	{
		return Interval(m_hasNaN && other.m_hasNaN,
						de::max(m_lo, other.m_lo),
						de::min(m_hi, other.m_hi));
	}